

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

void load_roller_data(birther *saved,birther *prev_player)

{
  int16_t iVar1;
  char *pcVar2;
  undefined1 local_70 [8];
  birther temp;
  wchar_t i;
  birther *prev_player_local;
  birther *saved_local;
  
  memset(local_70,0,0x50);
  if (prev_player != (birther *)0x0) {
    save_roller_data((birther *)local_70);
  }
  player->race = saved->race;
  player->class = saved->class;
  player->age = saved->age;
  iVar1 = saved->wt;
  player->wt_birth = iVar1;
  player->wt = iVar1;
  iVar1 = saved->ht;
  player->ht_birth = iVar1;
  player->ht = iVar1;
  player->au_birth = saved->au;
  player->au = (uint)z_info->start_gold;
  temp.name[0x1c] = '\0';
  temp.name[0x1d] = '\0';
  temp.name[0x1e] = '\0';
  temp.name[0x1f] = '\0';
  for (; (int)temp.name._28_4_ < 5; temp.name._28_4_ = temp.name._28_4_ + 1) {
    iVar1 = saved->stat[(int)temp.name._28_4_];
    player->stat_birth[(int)temp.name._28_4_] = iVar1;
    player->stat_cur[(int)temp.name._28_4_] = iVar1;
    player->stat_max[(int)temp.name._28_4_] = iVar1;
    player->stat_map[(int)temp.name._28_4_] = temp.name._28_2_;
  }
  if (player->history != (char *)0x0) {
    string_free(player->history);
  }
  pcVar2 = string_make(saved->history);
  player->history = pcVar2;
  my_strcpy(player->full_name,saved->name,0x20);
  if (prev_player != (birther *)0x0) {
    if (prev_player->history != (char *)0x0) {
      string_free(prev_player->history);
    }
    memcpy(prev_player,local_70,0x50);
  }
  return;
}

Assistant:

static void load_roller_data(birther *saved, birther *prev_player)
{
	int i;

     /* The initialisation is just paranoia - structure assignment is
        (perhaps) not strictly defined to work with uninitialised parts
        of structures. */
	birther temp;
	memset(&temp, 0, sizeof(birther));

	/* Save the current data if we'll need it later */
	if (prev_player)
		save_roller_data(&temp);

	/* Load previous data */
	player->race     = saved->race;
	player->class    = saved->class;
	player->age      = saved->age;
	player->wt       = player->wt_birth = saved->wt;
	player->ht       = player->ht_birth = saved->ht;
	player->au_birth = saved->au;
	player->au       = z_info->start_gold;

	/* Load previous stats */
	for (i = 0; i < STAT_MAX; i++) {
		player->stat_max[i] = player->stat_cur[i] = player->stat_birth[i]
			= saved->stat[i];
		player->stat_map[i] = i;
	}

	/* Load previous history */
	if (player->history) {
		string_free(player->history);
	}
	player->history = string_make(saved->history);
	my_strcpy(player->full_name, saved->name, sizeof(player->full_name));

	/* Save the current data if the caller is interested in it. */
	if (prev_player) {
		if (prev_player->history) {
			string_free(prev_player->history);
		}
		*prev_player = temp;
	}
}